

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::small_vector
          (small_vector<unsigned_char,_128UL> *this,small_vector<unsigned_char,_128UL> *rhs)

{
  uchar *__value;
  ulong uVar1;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> local_30;
  
  memset(this,0,0xa0);
  this->buffer_ = (this->small_buffer_)._M_elems;
  uVar1 = rhs->elements_;
  if (0x80 < uVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->big_buffer_,uVar1);
    uVar1 = rhs->elements_;
  }
  __value = rhs->buffer_;
  if (0 < (long)uVar1) {
    uVar1 = uVar1 + 1;
    local_30.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=
                (&local_30,__value);
      __value = __value + 1;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }